

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_short,_4U> * __thiscall
ImageT<unsigned_short,_4U>::normalize(ImageT<unsigned_short,_4U> *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  
  uVar1 = (this->super_Image).height;
  uVar2 = (this->super_Image).width;
  for (lVar3 = 0; (ulong)(uVar1 * uVar2) << 3 != lVar3; lVar3 = lVar3 + 8) {
    color<unsigned_short,_4U>::normalize
              ((color<unsigned_short,_4U> *)((long)&this->pixels->field_0 + lVar3));
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }